

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_choice(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  lysp_node *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  lysp_node *parent_00;
  lysp_node *plVar4;
  char *pcVar5;
  char **ppcVar6;
  char *format;
  ly_ctx *plVar7;
  ly_stmt lVar8;
  lysp_ext_instance **exts_00;
  bool bVar9;
  undefined4 uStack_90;
  ly_stmt kw;
  lysp_node *local_88;
  char *word;
  size_t word_len;
  uint16_t *local_70;
  char **local_68;
  lysp_qname **local_60;
  char **local_58;
  uint16_t *local_50;
  char **local_48;
  lysp_node **local_40;
  char *buf;
  
  parent_00 = (lysp_node *)calloc(1,0x68);
  if (parent_00 == (lysp_node *)0x0) {
    LVar3 = LY_EMEM;
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_choice");
  }
  else {
    plVar1 = *siblings;
    if (*siblings != (lysp_node *)0x0) {
      do {
        plVar4 = plVar1;
        plVar1 = plVar4->next;
      } while (plVar1 != (lysp_node *)0x0);
      siblings = &plVar4->next;
    }
    *siblings = parent_00;
    parent_00->nodetype = 2;
    parent_00->parent = parent;
    exts_00 = (lysp_ext_instance **)&buf;
    LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts_00,&word_len);
    if (LVar3 == LY_SUCCESS) {
      if (buf == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = word;
        if (word_len == 0) {
          pcVar5 = "";
        }
        LVar3 = lydict_insert(plVar7,pcVar5,word_len,&parent_00->name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar3 = lydict_insert_zc(plVar7,word,&parent_00->name);
      }
      if ((LVar3 == LY_SUCCESS) &&
         (LVar3 = get_keyword(ctx,&kw,&word,&word_len), LVar3 == LY_SUCCESS)) {
        if (kw == LY_STMT_SYNTAX_SEMICOLON) {
          bVar9 = false;
        }
        else {
          if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar7 = (ly_ctx *)0x0;
            }
            else {
              plVar7 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar5 = lyplg_ext_stmt2str(kw);
            ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar5);
            return LY_EVALID;
          }
          LVar3 = get_keyword(ctx,&kw,&word,&word_len);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        exts = &parent_00->exts;
        local_88 = parent_00 + 1;
        local_40 = &parent_00[1].next;
        local_48 = &parent_00[1].dsc;
        local_50 = &parent_00[1].nodetype;
        local_70 = &parent_00->flags;
        local_58 = &parent_00->ref;
        local_60 = &parent_00->iffeatures;
        local_68 = &parent_00->dsc;
        lVar8 = kw;
        do {
          if (!bVar9) {
            return LY_SUCCESS;
          }
          if (lVar8 == LY_STMT_ANYDATA) {
            plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar2[2].schema < 2) {
              plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
              format = 
              "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
              ;
              pcVar5 = "anydata";
LAB_00171fef:
              ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar5,"choice");
              return LY_EVALID;
            }
LAB_00171ea3:
            LVar3 = parse_any(ctx,lVar8,parent_00,&local_88->parent);
LAB_00171eb5:
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
          }
          else {
            if (lVar8 == LY_STMT_ANYXML) goto LAB_00171ea3;
            if (lVar8 == LY_STMT_CASE) {
              LVar3 = parse_case(ctx,parent_00,&local_88->parent);
              goto LAB_00171eb5;
            }
            if (lVar8 == LY_STMT_CHOICE) {
              plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar2[2].schema < 2) {
                plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                format = 
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ;
                pcVar5 = "choice";
                goto LAB_00171fef;
              }
              LVar3 = parse_choice(ctx,parent_00,&local_88->parent);
              goto LAB_00171eb5;
            }
            if (lVar8 == LY_STMT_CONTAINER) {
              LVar3 = parse_container(ctx,parent_00,&local_88->parent);
              goto LAB_00171eb5;
            }
            if (lVar8 == LY_STMT_LEAF) {
              LVar3 = parse_leaf(ctx,parent_00,&local_88->parent);
              goto LAB_00171eb5;
            }
            if (lVar8 == LY_STMT_LEAF_LIST) {
              LVar3 = parse_leaflist(ctx,parent_00,&local_88->parent);
              goto LAB_00171eb5;
            }
            if (lVar8 == LY_STMT_LIST) {
              LVar3 = parse_list(ctx,parent_00,&local_88->parent);
              goto LAB_00171eb5;
            }
            if (lVar8 == LY_STMT_WHEN) {
              LVar3 = parse_when(ctx,(lysp_when **)local_50);
              goto LAB_00171eb5;
            }
            if (lVar8 != LY_STMT_DEFAULT) {
              if (lVar8 == LY_STMT_DESCRIPTION) {
                pcVar5 = *local_68;
                lVar8 = LY_STMT_DESCRIPTION;
                ppcVar6 = local_68;
LAB_00171e06:
                exts_00 = (lysp_ext_instance **)0x2;
                LVar3 = parse_text_field(ctx,pcVar5,lVar8,(uint32_t)ppcVar6,(char **)0x2,
                                         Y_IDENTIF_ARG,(uint16_t *)exts,
                                         (lysp_ext_instance **)CONCAT44(kw,uStack_90));
              }
              else if (lVar8 == LY_STMT_EXTENSION_INSTANCE) {
                exts_00 = (lysp_ext_instance **)0x200;
                LVar3 = parse_ext(ctx,word,word_len,parent_00,LY_STMT_CHOICE,0,exts);
              }
              else if (lVar8 == LY_STMT_IF_FEATURE) {
                LVar3 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_60,(yang_arg)exts,exts_00);
              }
              else if (lVar8 == LY_STMT_MANDATORY) {
                LVar3 = parse_mandatory(ctx,local_70,exts);
              }
              else {
                if (lVar8 == LY_STMT_REFERENCE) {
                  pcVar5 = *local_58;
                  lVar8 = LY_STMT_REFERENCE;
                  ppcVar6 = local_58;
                  goto LAB_00171e06;
                }
                if (lVar8 == LY_STMT_STATUS) {
                  LVar3 = parse_status(ctx,local_70,exts);
                }
                else {
                  if (lVar8 != LY_STMT_CONFIG) {
                    if (ctx == (lysp_yang_ctx *)0x0) {
                      plVar7 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar7 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    pcVar5 = lyplg_ext_stmt2str(lVar8);
                    format = "Invalid keyword \"%s\" as a child of \"%s\".";
                    goto LAB_00171fef;
                  }
                  LVar3 = parse_config(ctx,local_70,exts);
                }
              }
              goto LAB_00171eb5;
            }
            exts_00 = (lysp_ext_instance **)0x1;
            LVar3 = parse_text_field(ctx,local_40,LY_STMT_DEFAULT,(uint32_t)local_40,(char **)0x1,
                                     (yang_arg)local_48,(uint16_t *)exts,
                                     (lysp_ext_instance **)CONCAT44(kw,uStack_90));
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            parent_00[1].name =
                 (char *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          LVar3 = get_keyword(ctx,&kw,&word,&word_len);
          lVar8 = kw;
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
          if (((!bVar9) && (*exts != (lysp_ext_instance *)0x0)) &&
             (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
             LVar3 != LY_SUCCESS)) {
            return LVar3;
          }
        } while( true );
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
parse_choice(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_choice *choice;

    /* create new choice structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, choice, next, LY_EMEM);
    choice->nodetype = LYS_CHOICE;
    choice->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, choice->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &choice->flags, &choice->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, choice->dsc, LY_STMT_DESCRIPTION, 0, &choice->dsc, Y_STR_ARG, NULL,
                    &choice->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &choice->iffeatures, Y_STR_ARG, &choice->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &choice->flags, &choice->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, choice->ref, LY_STMT_REFERENCE, 0, &choice->ref, Y_STR_ARG, NULL,
                    &choice->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &choice->flags, &choice->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &choice->when));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_text_field(ctx, &choice->dflt, LY_STMT_DEFAULT, 0, &choice->dflt.str, Y_PREF_IDENTIF_ARG,
                    &choice->dflt.flags, &choice->exts));
            choice->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "choice");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_CASE:
            LY_CHECK_RET(parse_case(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_CHOICE:
            PARSER_CHECK_STMTVER2_RET(ctx, "choice", "choice");
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)choice, &choice->child));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, choice, LY_STMT_CHOICE, 0, &choice->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "choice");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, choice->exts, ret, cleanup);
    }

cleanup:
    return ret;
}